

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

double __kmp_api_omp_get_wtick(void)

{
  double in_RAX;
  double data;
  double local_8;
  
  local_8 = in_RAX;
  if (__kmp_init_serial == 0) {
    __kmp_serial_initialize();
  }
  __kmp_elapsed_tick(&local_8);
  return local_8;
}

Assistant:

double FTN_STDCALL
xexpand(FTN_GET_WTICK)( void )
{
    #ifdef KMP_STUB
        return __kmps_get_wtick();
    #else
        double data;
        if ( ! __kmp_init_serial ) {
            __kmp_serial_initialize();
        };
        __kmp_elapsed_tick( & data );
        return data;
    #endif
}